

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::StreamingReporterBase<Catch::XmlReporter>::testGroupStarting
          (StreamingReporterBase<Catch::XmlReporter> *this,GroupInfo *_groupInfo)

{
  GroupInfo *_groupInfo_local;
  StreamingReporterBase<Catch::XmlReporter> *this_local;
  
  LazyStat<Catch::GroupInfo>::operator=(&this->currentGroupInfo,_groupInfo);
  return;
}

Assistant:

void testGroupStarting(GroupInfo const& _groupInfo) override {
            currentGroupInfo = _groupInfo;
        }